

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceVisitor.hpp
# Opt level: O2

void __thiscall
netlist::InstanceVisitor::handleInstanceMemberPorts(InstanceVisitor *this,InstanceSymbol *symbol)

{
  iterator symbol_00;
  NetlistPortDeclaration *port;
  Symbol *member;
  subrange<slang::ast::Scope::iterator,_slang::ast::Scope::iterator,_(std::ranges::subrange_kind)0>
  sVar1;
  
  sVar1 = slang::ast::Scope::members(&symbol->body->super_Scope);
  for (symbol_00 = sVar1._M_begin.current; symbol_00.current != sVar1._M_end.current.current;
      symbol_00.current = (symbol_00.current)->nextInScope) {
    if ((symbol_00.current)->kind == Port) {
      port = Netlist::addPortDeclaration(this->netlist,symbol_00.current);
      connectPortInternal(this,&port->super_NetlistNode);
    }
  }
  return;
}

Assistant:

auto handleInstanceMemberPorts(ast::InstanceSymbol const& symbol) {

        for (auto& member : symbol.body.members()) {
            if (member.kind == ast::SymbolKind::Port) {
                // Create the port declaration netlist node and connect it to
                // the corresponding local variable declaration.
                auto& portNode = netlist.addPortDeclaration(member);
                connectPortInternal(portNode);
            }
        }
    }